

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BoyerMooreFind.h
# Opt level: O0

bool __thiscall
axl::sl::
BoyerMooreTextFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8ReverseDecoder,_true,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
::setPattern(BoyerMooreTextFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8ReverseDecoder,_true,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
             *this,StringRef_utf32 *pattern)

{
  wchar_t *pwVar1;
  size_t sVar2;
  wchar_t *pwVar3;
  StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_> *in_RSI;
  Array *in_RDI;
  size_t i;
  Rwi rwi;
  bool result;
  size_t length;
  Array<wchar_t,_axl::sl::ArrayDetails<wchar_t>_> *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  wchar_t in_stack_ffffffffffffffb4;
  size_t in_stack_ffffffffffffffc0;
  wchar_t *pattern_00;
  Rwi in_stack_ffffffffffffffd0;
  Array *p;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar4;
  
  p = in_RDI;
  pwVar1 = (wchar_t *)
           StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::getLength(in_RSI);
  StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::cp(in_RSI);
  sVar2 = Array<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>::copyReverse
                    ((Array<wchar_t,_axl::sl::ArrayDetails<wchar_t>_> *)
                     CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),(wchar_t *)p,
                     (size_t)in_RSI);
  if (sVar2 == 0) {
    bVar4 = false;
  }
  else {
    Array<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>::Rwi::Rwi
              ((Rwi *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffa8);
    for (pattern_00 = (wchar_t *)0x0; pattern_00 < pwVar1;
        pattern_00 = (wchar_t *)((long)pattern_00 + 1)) {
      Array<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>::Rwi::operator[]
                ((Rwi *)&stack0xffffffffffffffd0,(size_t)pattern_00);
      in_stack_ffffffffffffffb4 =
           enc::ToCaseFolded::operator()
                     ((ToCaseFolded *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      (utf32_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
      pwVar3 = Array<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>::Rwi::operator[]
                         ((Rwi *)&stack0xffffffffffffffd0,(size_t)pattern_00);
      *pwVar3 = in_stack_ffffffffffffffb4;
    }
    sl::Array::operator_cast_to_wchar_t_(in_RDI);
    BoyerMooreSkipTablesBase<wchar_t>::build
              ((BoyerMooreSkipTablesBase<wchar_t> *)in_stack_ffffffffffffffd0.m_p,pattern_00,
               in_stack_ffffffffffffffc0,(size_t)in_RDI);
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool
	setPattern(const sl::StringRef_utf32& pattern) {
		size_t length = pattern.getLength();
		bool result = IsReverse ?
			this->m_pattern.copyReverse(pattern.cp(), length) :
			this->m_pattern.copy(pattern.cp(), length);

		if (!result)
			return false;

		if (IsCaseFolded) {
			typename Array<typename Details::C>::Rwi rwi = this->m_pattern;
			for (size_t i = 0; i < length; i++)
				rwi[i] = CaseOp()(rwi[i]);
		}

		this->m_skipTables.build(this->m_pattern, length, Details::BadSkipTableSize);
		return true;
	}